

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absval.cpp
# Opt level: O2

int __thiscall ncnn::AbsVal::forward_inplace(AbsVal *this,Mat *bottom_top_blob)

{
  float fVar1;
  void *pvVar2;
  int i;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int c;
  Mat local_60;
  
  uVar5 = bottom_top_blob->h * bottom_top_blob->w;
  uVar3 = 0;
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar6 = uVar3;
  }
  iVar4 = bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    iVar4 = 0;
  }
  while (c = (int)uVar3, c != iVar4) {
    Mat::channel(&local_60,bottom_top_blob,c);
    pvVar2 = local_60.data;
    Mat::~Mat(&local_60);
    for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
      fVar1 = *(float *)((long)pvVar2 + uVar3 * 4);
      if (fVar1 < 0.0) {
        *(float *)((long)pvVar2 + uVar3 * 4) = -fVar1;
      }
    }
    uVar3 = (ulong)(c + 1);
  }
  return 0;
}

Assistant:

int AbsVal::forward_inplace(Mat& bottom_top_blob) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            if (ptr[i] < 0)
                ptr[i] = -ptr[i];
        }
    }

    return 0;
}